

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdgen.c
# Opt level: O2

char * readpassphrase(char *filename)

{
  FILE *pFVar1;
  int iVar2;
  FILE *__stream;
  char *__s;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  
  __stream = fopen(filename,"r");
  pFVar1 = _stderr;
  if (__stream == (FILE *)0x0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    __s = (char *)0x0;
    fprintf(pFVar1,"puttygen: cannot open %s: %s\n",filename,pcVar5);
  }
  else {
    __s = fgetline((FILE *)__stream);
    if (__s == (char *)0x0) {
      iVar2 = ferror(__stream);
      pFVar1 = _stderr;
      if (iVar2 == 0) {
        __s = dupstr("");
      }
      else {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        __s = (char *)0x0;
        fprintf(pFVar1,"puttygen: error reading from %s: %s\n",filename,pcVar5);
      }
    }
    else {
      sVar3 = strcspn(__s,"\r\n");
      __s[sVar3] = '\0';
    }
    fclose(__stream);
  }
  return __s;
}

Assistant:

static char *readpassphrase(const char *filename)
{
    FILE *fp;
    char *line;

    fp = fopen(filename, "r");
    if (!fp) {
        fprintf(stderr, "puttygen: cannot open %s: %s\n",
                filename, strerror(errno));
        return NULL;
    }
    line = fgetline(fp);
    if (line)
        line[strcspn(line, "\r\n")] = '\0';
    else if (ferror(fp))
        fprintf(stderr, "puttygen: error reading from %s: %s\n",
                filename, strerror(errno));
    else        /* empty file */
        line = dupstr("");
    fclose(fp);
    return line;
}